

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O0

void __thiscall hdc::Def::addParameter(Def *this,Token *name,Type *type)

{
  int value;
  Variable *this_00;
  Variable *local_28;
  Parameter *param;
  Type *type_local;
  Token *name_local;
  Def *this_local;
  
  param = (Parameter *)type;
  type_local = (Type *)name;
  name_local = (Token *)this;
  this_00 = (Variable *)operator_new(0x68);
  Parameter::Parameter((Parameter *)this_00,(Token *)type_local,(Type *)param);
  value = this->localVarNameCounter;
  this->localVarNameCounter = value + 1;
  local_28 = this_00;
  Variable::setLocalName(this_00,value);
  std::vector<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::push_back
            (&this->parameters,(value_type *)&local_28);
  return;
}

Assistant:

void Def::addParameter(hdc::Token& name, Type* type) {
    Parameter* param;

    param = new Parameter(name, type);
    param->setLocalName(localVarNameCounter++);
    parameters.push_back(param);
}